

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *elem,xmlChar *name,xmlChar *ns,
                   xmlAttributeType type,xmlAttributeDefault def,xmlChar *defaultValue,
                   xmlEnumerationPtr tree)

{
  int iVar1;
  void *pvVar2;
  xmlChar *pxVar3;
  xmlElementPtr elem_00;
  bool bVar4;
  xmlAttributePtr local_68;
  xmlAttributePtr tmp;
  xmlDictPtr dict;
  xmlElementPtr elemDef;
  xmlAttributeTablePtr table;
  xmlAttributePtr ret;
  xmlAttributeType type_local;
  xmlChar *ns_local;
  xmlChar *name_local;
  xmlChar *elem_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  tmp = (xmlAttributePtr)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    xmlFreeEnumeration(tree);
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    xmlFreeEnumeration(tree);
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if (elem == (xmlChar *)0x0) {
    xmlFreeEnumeration(tree);
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else {
    if (dtd->doc != (_xmlDoc *)0x0) {
      tmp = (xmlAttributePtr)dtd->doc->dict;
    }
    if (type - XML_ATTRIBUTE_CDATA < 9 || type == XML_ATTRIBUTE_NOTATION) {
      switch((long)&switchD_001dabed::switchdataD_00287c90 +
             (long)(int)(&switchD_001dabed::switchdataD_00287c90)[type - XML_ATTRIBUTE_CDATA]) {
      case 0x1dabef:
        break;
      case 0x1dabf1:
        break;
      case 0x1dabf3:
        break;
      case 0x1dabf5:
        break;
      case 0x1dabf7:
        break;
      case 0x1dabf9:
        break;
      case 0x1dabfb:
        break;
      case 0x1dabfd:
        break;
      case 0x1dabff:
        break;
      case 0x1dac01:
      }
      if ((defaultValue != (xmlChar *)0x0) &&
         (iVar1 = xmlValidateAttributeValueInternal(dtd->doc,type,defaultValue), iVar1 == 0)) {
        xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_DEFAULT,
                        "Attribute %s of %s: invalid default value\n",elem,name,defaultValue);
        defaultValue = (xmlChar *)0x0;
        if (ctxt != (xmlValidCtxtPtr)0x0) {
          ctxt->valid = 0;
        }
      }
      if ((((dtd->doc == (_xmlDoc *)0x0) || (dtd->doc->extSubset != dtd)) ||
          (dtd->doc->intSubset == (_xmlDtd *)0x0)) ||
         ((dtd->doc->intSubset->attributes == (void *)0x0 ||
          (pvVar2 = xmlHashLookup3((xmlHashTablePtr)dtd->doc->intSubset->attributes,name,ns,elem),
          pvVar2 == (void *)0x0)))) {
        elemDef = (xmlElementPtr)dtd->attributes;
        if (elemDef == (xmlElementPtr)0x0) {
          elemDef = (xmlElementPtr)xmlHashCreateDict(0,(xmlDictPtr)tmp);
          dtd->attributes = elemDef;
        }
        if (elemDef == (xmlElementPtr)0x0) {
          xmlVErrMemory(ctxt,"xmlAddAttributeDecl: Table creation failed!\n");
          xmlFreeEnumeration(tree);
          ctxt_local = (xmlValidCtxtPtr)0x0;
        }
        else {
          ctxt_local = (xmlValidCtxtPtr)(*xmlMalloc)(0x78);
          if ((xmlAttributePtr)ctxt_local == (xmlAttributePtr)0x0) {
            xmlVErrMemory(ctxt,"malloc failed");
            xmlFreeEnumeration(tree);
            ctxt_local = (xmlValidCtxtPtr)0x0;
          }
          else {
            memset(ctxt_local,0,0x78);
            ((xmlAttributePtr)ctxt_local)->type = XML_ATTRIBUTE_DECL;
            ((xmlAttributePtr)ctxt_local)->atype = type;
            ((xmlAttributePtr)ctxt_local)->doc = dtd->doc;
            if (tmp == (xmlAttributePtr)0x0) {
              pxVar3 = xmlStrdup(name);
              ((xmlAttributePtr)ctxt_local)->name = pxVar3;
              pxVar3 = xmlStrdup(ns);
              ((xmlAttributePtr)ctxt_local)->prefix = pxVar3;
              pxVar3 = xmlStrdup(elem);
              ((xmlAttributePtr)ctxt_local)->elem = pxVar3;
            }
            else {
              pxVar3 = xmlDictLookup((xmlDictPtr)tmp,name,-1);
              ((xmlAttributePtr)ctxt_local)->name = pxVar3;
              pxVar3 = xmlDictLookup((xmlDictPtr)tmp,ns,-1);
              ((xmlAttributePtr)ctxt_local)->prefix = pxVar3;
              pxVar3 = xmlDictLookup((xmlDictPtr)tmp,elem,-1);
              ((xmlAttributePtr)ctxt_local)->elem = pxVar3;
            }
            ((xmlAttributePtr)ctxt_local)->def = def;
            ((xmlAttributePtr)ctxt_local)->tree = tree;
            if (defaultValue != (xmlChar *)0x0) {
              if (tmp == (xmlAttributePtr)0x0) {
                pxVar3 = xmlStrdup(defaultValue);
                ((xmlAttributePtr)ctxt_local)->defaultValue = pxVar3;
              }
              else {
                pxVar3 = xmlDictLookup((xmlDictPtr)tmp,defaultValue,-1);
                ((xmlAttributePtr)ctxt_local)->defaultValue = pxVar3;
              }
            }
            iVar1 = xmlHashAddEntry3((xmlHashTablePtr)elemDef,((xmlAttributePtr)ctxt_local)->name,
                                     ((xmlAttributePtr)ctxt_local)->prefix,
                                     ((xmlAttributePtr)ctxt_local)->elem,ctxt_local);
            if (iVar1 < 0) {
              xmlErrValidWarning(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_REDEFINED,
                                 "Attribute %s of element %s: already defined\n",name,elem,
                                 (xmlChar *)0x0);
              xmlFreeAttribute((xmlAttributePtr)ctxt_local);
              ctxt_local = (xmlValidCtxtPtr)0x0;
            }
            else {
              elem_00 = xmlGetDtdElementDesc2(dtd,elem,1);
              if (elem_00 != (xmlElementPtr)0x0) {
                if (((type == XML_ATTRIBUTE_ID) &&
                    (iVar1 = xmlScanIDAttributeDecl((xmlValidCtxtPtr)0x0,elem_00,1), iVar1 != 0)) &&
                   (xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_MULTIPLE_ID,
                                    "Element %s has too may ID attributes defined : %s\n",elem,name,
                                    (xmlChar *)0x0), ctxt != (xmlValidCtxtPtr)0x0)) {
                  ctxt->valid = 0;
                }
                iVar1 = xmlStrEqual(((xmlAttributePtr)ctxt_local)->name,"xmlns");
                if ((iVar1 == 0) &&
                   ((((xmlAttributePtr)ctxt_local)->prefix == (xmlChar *)0x0 ||
                    (iVar1 = xmlStrEqual(((xmlAttributePtr)ctxt_local)->prefix,"xmlns"), iVar1 == 0)
                    ))) {
                  local_68 = elem_00->attributes;
                  while( true ) {
                    bVar4 = false;
                    if (local_68 != (xmlAttributePtr)0x0) {
                      iVar1 = xmlStrEqual(local_68->name,"xmlns");
                      bVar4 = true;
                      if ((iVar1 == 0) &&
                         (bVar4 = false, ((xmlAttributePtr)ctxt_local)->prefix != (xmlChar *)0x0)) {
                        iVar1 = xmlStrEqual(((xmlAttributePtr)ctxt_local)->prefix,"xmlns");
                        bVar4 = iVar1 != 0;
                      }
                    }
                    if ((!bVar4) || (local_68->nexth == (_xmlAttribute *)0x0)) break;
                    local_68 = local_68->nexth;
                  }
                  if (local_68 == (xmlAttributePtr)0x0) {
                    ((xmlAttributePtr)ctxt_local)->nexth = elem_00->attributes;
                    elem_00->attributes = (xmlAttributePtr)ctxt_local;
                  }
                  else {
                    ((xmlAttributePtr)ctxt_local)->nexth = local_68->nexth;
                    local_68->nexth = (_xmlAttribute *)ctxt_local;
                  }
                }
                else {
                  ((xmlAttributePtr)ctxt_local)->nexth = elem_00->attributes;
                  elem_00->attributes = (xmlAttributePtr)ctxt_local;
                }
              }
              ((xmlAttributePtr)ctxt_local)->parent = dtd;
              if (dtd->last == (_xmlNode *)0x0) {
                dtd->last = (_xmlNode *)ctxt_local;
                dtd->children = (_xmlNode *)ctxt_local;
              }
              else {
                dtd->last->next = (_xmlNode *)ctxt_local;
                ((xmlAttributePtr)ctxt_local)->prev = dtd->last;
                dtd->last = (_xmlNode *)ctxt_local;
              }
            }
          }
        }
      }
      else {
        xmlFreeEnumeration(tree);
        ctxt_local = (xmlValidCtxtPtr)0x0;
      }
    }
    else {
      xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"Internal: ATTRIBUTE struct corrupted invalid type\n",
                  (char *)0x0);
      xmlFreeEnumeration(tree);
      ctxt_local = (xmlValidCtxtPtr)0x0;
    }
  }
  return (xmlAttributePtr)ctxt_local;
}

Assistant:

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,
                    xmlDtdPtr dtd, const xmlChar *elem,
                    const xmlChar *name, const xmlChar *ns,
		    xmlAttributeType type, xmlAttributeDefault def,
		    const xmlChar *defaultValue, xmlEnumerationPtr tree) {
    xmlAttributePtr ret;
    xmlAttributeTablePtr table;
    xmlElementPtr elemDef;
    xmlDictPtr dict = NULL;

    if (dtd == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (name == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (elem == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (dtd->doc != NULL)
	dict = dtd->doc->dict;

#ifdef LIBXML_VALID_ENABLED
    /*
     * Check the type and possibly the default value.
     */
    switch (type) {
        case XML_ATTRIBUTE_CDATA:
	    break;
        case XML_ATTRIBUTE_ID:
	    break;
        case XML_ATTRIBUTE_IDREF:
	    break;
        case XML_ATTRIBUTE_IDREFS:
	    break;
        case XML_ATTRIBUTE_ENTITY:
	    break;
        case XML_ATTRIBUTE_ENTITIES:
	    break;
        case XML_ATTRIBUTE_NMTOKEN:
	    break;
        case XML_ATTRIBUTE_NMTOKENS:
	    break;
        case XML_ATTRIBUTE_ENUMERATION:
	    break;
        case XML_ATTRIBUTE_NOTATION:
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid type\n",
		    NULL);
	    xmlFreeEnumeration(tree);
	    return(NULL);
    }
    if ((defaultValue != NULL) &&
        (!xmlValidateAttributeValueInternal(dtd->doc, type, defaultValue))) {
	xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_DEFAULT,
	                "Attribute %s of %s: invalid default value\n",
	                elem, name, defaultValue);
	defaultValue = NULL;
	if (ctxt != NULL)
	    ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check first that an attribute defined in the external subset wasn't
     * already defined in the internal subset
     */
    if ((dtd->doc != NULL) && (dtd->doc->extSubset == dtd) &&
	(dtd->doc->intSubset != NULL) &&
	(dtd->doc->intSubset->attributes != NULL)) {
        ret = xmlHashLookup3(dtd->doc->intSubset->attributes, name, ns, elem);
	if (ret != NULL) {
	    xmlFreeEnumeration(tree);
	    return(NULL);
	}
    }

    /*
     * Create the Attribute table if needed.
     */
    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL) {
        table = xmlHashCreateDict(0, dict);
	dtd->attributes = (void *) table;
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddAttributeDecl: Table creation failed!\n");
	xmlFreeEnumeration(tree);
        return(NULL);
    }


    ret = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlAttribute));
    ret->type = XML_ATTRIBUTE_DECL;

    /*
     * fill the structure.
     */
    ret->atype = type;
    /*
     * doc must be set before possible error causes call
     * to xmlFreeAttribute (because it's used to check on
     * dict use)
     */
    ret->doc = dtd->doc;
    if (dict) {
	ret->name = xmlDictLookup(dict, name, -1);
	ret->prefix = xmlDictLookup(dict, ns, -1);
	ret->elem = xmlDictLookup(dict, elem, -1);
    } else {
	ret->name = xmlStrdup(name);
	ret->prefix = xmlStrdup(ns);
	ret->elem = xmlStrdup(elem);
    }
    ret->def = def;
    ret->tree = tree;
    if (defaultValue != NULL) {
        if (dict)
	    ret->defaultValue = xmlDictLookup(dict, defaultValue, -1);
	else
	    ret->defaultValue = xmlStrdup(defaultValue);
    }

    /*
     * Validity Check:
     * Search the DTD for previous declarations of the ATTLIST
     */
    if (xmlHashAddEntry3(table, ret->name, ret->prefix, ret->elem, ret) < 0) {
#ifdef LIBXML_VALID_ENABLED
	/*
	 * The attribute is already defined in this DTD.
	 */
	xmlErrValidWarning(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_REDEFINED,
		 "Attribute %s of element %s: already defined\n",
		 name, elem, NULL);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeAttribute(ret);
	return(NULL);
    }

    /*
     * Validity Check:
     * Multiple ID per element
     */
    elemDef = xmlGetDtdElementDesc2(dtd, elem, 1);
    if (elemDef != NULL) {

#ifdef LIBXML_VALID_ENABLED
        if ((type == XML_ATTRIBUTE_ID) &&
	    (xmlScanIDAttributeDecl(NULL, elemDef, 1) != 0)) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_MULTIPLE_ID,
	   "Element %s has too may ID attributes defined : %s\n",
		   elem, name, NULL);
	    if (ctxt != NULL)
		ctxt->valid = 0;
	}
#endif /* LIBXML_VALID_ENABLED */

	/*
	 * Insert namespace default def first they need to be
	 * processed first.
	 */
	if ((xmlStrEqual(ret->name, BAD_CAST "xmlns")) ||
	    ((ret->prefix != NULL &&
	     (xmlStrEqual(ret->prefix, BAD_CAST "xmlns"))))) {
	    ret->nexth = elemDef->attributes;
	    elemDef->attributes = ret;
	} else {
	    xmlAttributePtr tmp = elemDef->attributes;

	    while ((tmp != NULL) &&
		   ((xmlStrEqual(tmp->name, BAD_CAST "xmlns")) ||
		    ((ret->prefix != NULL &&
		     (xmlStrEqual(ret->prefix, BAD_CAST "xmlns")))))) {
		if (tmp->nexth == NULL)
		    break;
		tmp = tmp->nexth;
	    }
	    if (tmp != NULL) {
		ret->nexth = tmp->nexth;
	        tmp->nexth = ret;
	    } else {
		ret->nexth = elemDef->attributes;
		elemDef->attributes = ret;
	    }
	}
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);
}